

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O0

QWidget * __thiscall QLayout::parentWidget(QLayout *this)

{
  QLayoutPrivate *this_00;
  QObject *pQVar1;
  QLayout *pQVar2;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QLayout *parentLayout;
  QLayoutPrivate *d;
  char *in_stack_ffffffffffffffa8;
  int line;
  QWidget *local_30;
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QLayout *)0x33c20a);
  if ((this_00->field_0x8c & 1) == 0) {
    pQVar1 = QObject::parent((QObject *)0x33c232);
    if (pQVar1 == (QObject *)0x0) {
      local_30 = (QWidget *)0x0;
    }
    else {
      QObject::parent((QObject *)0x33c242);
      pQVar2 = qobject_cast<QLayout*>((QObject *)0x33c24a);
      if (pQVar2 == (QLayout *)0x0) {
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)this_00,(char *)0x0,line,in_stack_ffffffffffffffa8);
        QMessageLogger::warning
                  (local_28,
                   "QLayout::parentWidget: A layout can only have another layout as a parent.");
        local_30 = (QWidget *)0x0;
      }
      else {
        local_30 = parentWidget((QLayout *)this_00);
      }
    }
  }
  else {
    local_30 = (QWidget *)QObject::parent((QObject *)0x33c2bb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QWidget *QLayout::parentWidget() const
{
    Q_D(const QLayout);
    if (!d->topLevel) {
        if (parent()) {
            QLayout *parentLayout = qobject_cast<QLayout*>(parent());
            if (Q_UNLIKELY(!parentLayout)) {
                qWarning("QLayout::parentWidget: A layout can only have another layout as a parent.");
                return nullptr;
            }
            return parentLayout->parentWidget();
        } else {
            return nullptr;
        }
    } else {
        Q_ASSERT(parent() && parent()->isWidgetType());
        return static_cast<QWidget *>(parent());
    }
}